

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestRegXmmEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86Reg_x86XmmReg *fun)

{
  int iVar1;
  uint local_38;
  uint local_34;
  uint xmm;
  uint reg;
  uchar *start;
  _func_int_uchar_ptr_x86Reg_x86XmmReg *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
      EMIT_OP_REG_REG(ctx,op,testRegs[local_34],testXmmRegs[local_38]);
      iVar1 = (*fun)(puStack_18,testRegs[local_34],testXmmRegs[local_38]);
      puStack_18 = puStack_18 + iVar1;
    }
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestRegXmmEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, x86XmmReg src))
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
		{
			EMIT_OP_REG_REG(ctx, op, testRegs[reg], testXmmRegs[xmm]);
			stream += fun(stream, testRegs[reg], testXmmRegs[xmm]);
		}
	}

	return int(stream - start);
}